

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O1

REF_STATUS
ref_edge_rcm_queue(REF_EDGE ref_edge,REF_INT node,REF_INT *o2n,REF_INT *n2o,REF_INT *ndone,
                  REF_INT *queue,REF_INT *nqueue)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  REF_ADJ ref_adj;
  REF_INT RVar4;
  REF_INT degree;
  REF_INT nhere;
  REF_INT local_48 [2];
  REF_ADJ local_40;
  REF_INT *local_38;
  
  ref_adj = ref_edge->adj;
  n2o[*ndone] = node;
  o2n[node] = *ndone;
  *ndone = *ndone + 1;
  local_48[1] = 0;
  uVar3 = 0xffffffff;
  if ((-1 < node) && (uVar3 = 0xffffffff, node < ref_adj->nnode)) {
    uVar3 = (ulong)(uint)ref_adj->first[node];
  }
  if ((int)uVar3 != -1) {
    RVar4 = ref_adj->item[(int)uVar3].ref;
    local_40 = ref_adj;
    local_38 = queue;
    do {
      iVar1 = ref_edge->e2n[RVar4 * 2];
      if (o2n[iVar1] == -1) {
        o2n[iVar1] = -2;
        uVar2 = ref_adj_degree(ref_adj,iVar1,local_48);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x302,"ref_edge_rcm_queue",(ulong)uVar2,"deg");
          return uVar2;
        }
        ref_edge_rcm_queue_node(iVar1,local_48[0],local_38,nqueue,local_48 + 1);
        ref_adj = local_40;
      }
      iVar1 = ref_edge->e2n[(int)(RVar4 * 2 | 1)];
      if (o2n[iVar1] == -1) {
        o2n[iVar1] = -2;
        uVar2 = ref_adj_degree(ref_adj,iVar1,local_48);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x309,"ref_edge_rcm_queue",(ulong)uVar2,"deg");
          return uVar2;
        }
        ref_edge_rcm_queue_node(iVar1,local_48[0],local_38,nqueue,local_48 + 1);
        ref_adj = local_40;
      }
      iVar1 = ref_adj->item[(int)uVar3].next;
      uVar3 = (ulong)iVar1;
      if (uVar3 == 0xffffffffffffffff) {
        RVar4 = -1;
      }
      else {
        RVar4 = ref_adj->item[uVar3].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue(REF_EDGE ref_edge, REF_INT node,
                                             REF_INT *o2n, REF_INT *n2o,
                                             REF_INT *ndone, REF_INT *queue,
                                             REF_INT *nqueue) {
  REF_ADJ ref_adj = ref_edge_adj(ref_edge);
  REF_INT item, ref, other, degree;
  REF_INT nhere;
  n2o[(*ndone)] = node;
  o2n[node] = (*ndone);
  (*ndone)++;
  nhere = 0;

  /* printf("%d done %d nq %d\n", *ndone, node, *nqueue); */

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    other = ref_edge_e2n(ref_edge, 0, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n0");
    }
    other = ref_edge_e2n(ref_edge, 1, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n1");
    }
  }

  return REF_SUCCESS;
}